

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_parser.hpp
# Opt level: O0

vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
* __thiscall
bioparser::FastaParser<biosoup::Sequence>::Parse
          (vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
           *__return_storage_ptr__,FastaParser<biosoup::Sequence> *this,uint64_t bytes,
          bool shorten_names)

{
  byte bVar1;
  uint32_t uVar2;
  vector<char,_std::allocator<char>_> *this_00;
  const_reference pvVar3;
  value_type c;
  uint local_68;
  bool local_61;
  uint32_t buffer_ptr;
  bool is_name;
  bool is_eof;
  anon_class_40_5_f07f430f create_T;
  undefined1 auStack_30 [4];
  uint32_t data_ptr;
  uint64_t parsed_bytes;
  pointer puStack_20;
  bool shorten_names_local;
  uint64_t bytes_local;
  FastaParser<biosoup::Sequence> *this_local;
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  *dst;
  
  parsed_bytes._6_1_ = 0;
  parsed_bytes._7_1_ = shorten_names;
  puStack_20 = (pointer)bytes;
  bytes_local = (uint64_t)this;
  this_local = (FastaParser<biosoup::Sequence> *)__return_storage_ptr__;
  std::
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ::vector(__return_storage_ptr__);
  _auStack_30 = (pointer)0x0;
  create_T.parsed_bytes._4_4_ = 0;
  _buffer_ptr = (uint32_t *)((long)&create_T.parsed_bytes + 4);
  create_T.data_ptr = (uint32_t *)((long)&parsed_bytes + 7);
  create_T.dst = (vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                  *)auStack_30;
  local_61 = false;
  bVar1 = 1;
  create_T.shorten_names = (bool *)this;
  create_T.this = (FastaParser<biosoup::Sequence> *)__return_storage_ptr__;
  while( true ) {
    for (local_68 = Parser<biosoup::Sequence>::buffer_ptr(&this->super_Parser<biosoup::Sequence>);
        uVar2 = Parser<biosoup::Sequence>::buffer_bytes(&this->super_Parser<biosoup::Sequence>),
        local_68 < uVar2; local_68 = local_68 + 1) {
      this_00 = Parser<biosoup::Sequence>::buffer(&this->super_Parser<biosoup::Sequence>);
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](this_00,(ulong)local_68);
      if (*pvVar3 == '\n') {
        uVar2 = Parser<biosoup::Sequence>::buffer_ptr(&this->super_Parser<biosoup::Sequence>);
        Parser<biosoup::Sequence>::Store
                  (&this->super_Parser<biosoup::Sequence>,(ulong)(local_68 - uVar2),(bool)~bVar1);
        if (bVar1 != 0) {
          create_T.parsed_bytes._4_4_ =
               Parser<biosoup::Sequence>::storage_ptr(&this->super_Parser<biosoup::Sequence>);
          bVar1 = 0;
        }
      }
      else if ((bVar1 == 0) && (*pvVar3 == '>')) {
        bVar1 = 1;
        Parse::anon_class_40_5_f07f430f::operator()((anon_class_40_5_f07f430f *)&buffer_ptr);
        if (puStack_20 <= _auStack_30) {
          return __return_storage_ptr__;
        }
      }
    }
    uVar2 = Parser<biosoup::Sequence>::buffer_ptr(&this->super_Parser<biosoup::Sequence>);
    if (uVar2 < local_68) {
      uVar2 = Parser<biosoup::Sequence>::buffer_ptr(&this->super_Parser<biosoup::Sequence>);
      Parser<biosoup::Sequence>::Store
                (&this->super_Parser<biosoup::Sequence>,(ulong)(local_68 - uVar2),(bool)~bVar1);
    }
    if (local_61 != false) break;
    local_61 = Parser<biosoup::Sequence>::Read(&this->super_Parser<biosoup::Sequence>);
  }
  uVar2 = Parser<biosoup::Sequence>::storage_ptr(&this->super_Parser<biosoup::Sequence>);
  if (uVar2 != 0) {
    Parse::anon_class_40_5_f07f430f::operator()((anon_class_40_5_f07f430f *)&buffer_ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<T>> Parse(
      std::uint64_t bytes, bool shorten_names = true) override {
    std::vector<std::unique_ptr<T>> dst;
    std::uint64_t parsed_bytes = 0;
    std::uint32_t data_ptr = 0;

    auto create_T = [&] () -> void {
      if (data_ptr == 0) {
        throw std::invalid_argument(
            "[bioparser::FastaParser] error: invalid file format");
      }

      auto name_len = shorten_names ?
          this->Shorten(this->storage().data(), data_ptr) :
          this->RightStrip(this->storage().data(), data_ptr);

      auto data_len = this->storage_ptr() - data_ptr;

      if (name_len == 0 || this->storage()[0] != '>' || data_len == 0) {
        throw std::invalid_argument(
            "[bioparser::FastaParser] error: invalid file format");
      }

      dst.emplace_back(std::unique_ptr<T>(new T(
          static_cast<const char*>(this->storage().data() + 1), name_len - 1,
          static_cast<const char*>(this->storage().data() + data_ptr), data_len)));  // NOLINT

      parsed_bytes += this->storage_ptr();
      data_ptr = 0;
      this->Clear();
    };

    bool is_eof = false;
    bool is_name = true;

    while (true) {
      auto buffer_ptr = this->buffer_ptr();
      for (; buffer_ptr < this->buffer_bytes(); ++buffer_ptr) {
        auto c = this->buffer()[buffer_ptr];
        if (c == '\n') {
          this->Store(buffer_ptr - this->buffer_ptr(), !is_name);
          if (is_name) {
            data_ptr = this->storage_ptr();
            is_name = false;
          }
        } else if (!is_name && c == '>') {
          is_name = true;
          create_T();
          if (parsed_bytes >= bytes) {
            return dst;
          }
        }
      }
      if (this->buffer_ptr() < buffer_ptr) {
        this->Store(buffer_ptr - this->buffer_ptr(), !is_name);
      }

      if (is_eof) {
        break;
      }
      is_eof = this->Read();
    }

    if (this->storage_ptr() != 0) {
      create_T();
    }

    return dst;
  }